

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

int __thiscall
array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_>::insert
          (array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_> *this,CSkin *item,range r)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int new_len;
  
  if (r.begin < r.end) {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/base/tl/range.h"
                   ,0x96,1,"empty");
    iVar2 = (int)((long)r.begin - (long)this->list >> 3) * -0x3d70a3d7;
    incsize(this);
    iVar1 = this->num_elements;
    lVar3 = (long)iVar1;
    new_len = iVar1 + 1;
    if (this->list_size <= iVar1) {
      alloc(this,new_len);
    }
    this->num_elements = new_len;
    if (iVar2 < iVar1) {
      lVar4 = lVar3 * 200;
      do {
        memcpy(this->list->m_aName + lVar4 + -4,this->list + (long)new_len + -2,200);
        lVar3 = lVar3 + -1;
        new_len = new_len + -1;
        lVar4 = lVar4 + -200;
      } while (iVar2 < lVar3);
    }
    memcpy(this->list + iVar2,item,200);
    return this->num_elements + -1;
  }
  iVar1 = add(this,item);
  return iVar1;
}

Assistant:

int insert(const T& item, range r)
	{
		if(r.empty())
			return add(item);

		int index = (int)(&r.front()-list);
		incsize();
		set_size(size()+1);

		for(int i = num_elements-1; i > index; i--)
			list[i] = list[i-1];

		list[index] = item;

		return num_elements-1;
	}